

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandEliminate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Abc_Ntk_t *pNtk;
  char *pcVar5;
  uint fVerbose;
  int iVar6;
  char *pcVar7;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar2 = false;
  Extra_UtilGetoptReset();
  local_44 = 1;
  local_50 = 0xc;
  local_48 = 0xffffffff;
  local_4c = 0;
  bVar1 = false;
  fVerbose = 0;
LAB_001eadd5:
  do {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"VNIgrsvh"), iVar6 = globalUtilOptind, iVar3 == 0x76
            ) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar3 == -1) {
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar5 = "Empty network.\n";
        }
        else if (pNtk->nObjCounts[7] == 0) {
          pcVar5 = "The network does not have internal nodes.\n";
        }
        else {
          if (pNtk->ntkType == ABC_NTK_LOGIC) {
            if (bVar1) {
              Abc_NtkEliminateSpecial(pNtk,1000,fVerbose);
            }
            else if (bVar2) {
              Abc_NtkEliminate(pNtk,local_50,local_4c,fVerbose);
            }
            else {
              Abc_NtkEliminate1(pNtk,local_48,local_50,local_44,local_4c,fVerbose);
            }
            return 0;
          }
          pcVar5 = 
          "This command can only be applied to a logic network (run \"renode\" or \"if\").\n";
        }
        iVar6 = -1;
        goto LAB_001eb03c;
      }
      if (iVar3 != 0x49) break;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-I\" should be followed by a positive integer.\n";
LAB_001eaf3f:
        Abc_Print(-1,pcVar5);
        goto LAB_001eaf49;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_44 = uVar4;
LAB_001eaeac:
      globalUtilOptind = iVar6 + 1;
      if ((int)uVar4 < 1) goto LAB_001eaf49;
    }
    if (iVar3 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-N\" should be followed by a positive integer.\n";
        goto LAB_001eaf3f;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_50 = uVar4;
      goto LAB_001eaeac;
    }
    if (iVar3 != 0x73) {
      if (iVar3 == 0x67) {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      else if (iVar3 == 0x72) {
        local_4c = local_4c ^ 1;
      }
      else {
        if (iVar3 != 0x56) goto LAB_001eaf49;
        if (argc <= globalUtilOptind) {
          pcVar5 = 
          "Command line switch \"-V\" should be followed by an integer that is -1 or larger.\n";
          goto LAB_001eaf3f;
        }
        local_48 = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar6 + 1;
        if ((int)local_48 < -1) {
LAB_001eaf49:
          iVar6 = -2;
          Abc_Print(-2,"usage: eliminate [-VNI <num>] [-grsvh]\n");
          Abc_Print(-2,
                    "\t           traditional \"eliminate -1\", which collapses the node into its fanout\n"
                   );
          Abc_Print(-2,
                    "\t           if the node\'s variable appears in the fanout\'s factored form only once\n"
                   );
          Abc_Print(-2,
                    "\t-V <num> : the \"value\" parameter used by \"eliminate\" in SIS [default = %d]\n"
                    ,(ulong)local_48);
          Abc_Print(-2,"\t-N <num> : the maximum node support after collapsing [default = %d]\n",
                    (ulong)local_50);
          Abc_Print(-2,"\t-I <num> : the maximum number of iterations [default = %d]\n",
                    (ulong)local_44);
          pcVar7 = "yes";
          pcVar5 = "yes";
          if (!bVar2) {
            pcVar5 = "no";
          }
          Abc_Print(-2,
                    "\t-g       : toggle using greedy eliminate (without \"value\") [default = %s]\n"
                    ,pcVar5);
          pcVar5 = "yes";
          if (local_4c == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-r       : use the reverse topological order [default = %s]\n",pcVar5);
          pcVar5 = "yes";
          if (!bVar1) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-s       : toggle eliminating similar nodes [default = %s]\n",pcVar5);
          if (fVerbose == 0) {
            pcVar7 = "no";
          }
          Abc_Print(-2,"\t-v       : print verbose information [default = %s]\n",pcVar7);
          pcVar5 = "\t-h       : print the command usage\n";
LAB_001eb03c:
          Abc_Print(iVar6,pcVar5);
          return 1;
        }
      }
      goto LAB_001eadd5;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  } while( true );
}

Assistant:

int Abc_CommandEliminate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int ElimValue;
    int nMaxSize;
    int nIterMax;
    int fGreedy;
    int fReverse;
    int fSpecial;
    int fVerbose;
    int c;
    extern int Abc_NtkEliminate( Abc_Ntk_t * pNtk, int nMaxSize, int fReverse, int fVerbose );
    extern int Abc_NtkEliminate1( Abc_Ntk_t * pNtk, int ElimValue, int nMaxSize, int nIterMax, int fReverse, int fVerbose );
    extern int Abc_NtkEliminateSpecial( Abc_Ntk_t * pNtk, int nMaxSize, int fVerbose );

    // set the defaults
    ElimValue = -1;
    nMaxSize  = 12;
    nIterMax  =  1;
    fGreedy   =  0;
    fReverse  =  0;
    fSpecial  =  0;
    fVerbose  =  0;
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "VNIgrsvh")) != EOF )
    {
        switch (c)
        {
            case 'V':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer that is -1 or larger.\n" );
                    goto usage;
                }
                ElimValue = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( ElimValue < -1 )
                    goto usage;
                break;
            case 'N':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nMaxSize = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nMaxSize <= 0 )
                    goto usage;
                break;
            case 'I':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-I\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nIterMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nIterMax <= 0 )
                    goto usage;
                break;
            case 'g':
                fGreedy ^= 1;
                break;
            case 'r':
                fReverse ^= 1;
                break;
            case 's':
                fSpecial ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkNodeNum(pNtk) == 0 )
    {
        Abc_Print( -1, "The network does not have internal nodes.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network (run \"renode\" or \"if\").\n" );
        return 1;
    }

    if ( fSpecial )
        Abc_NtkEliminateSpecial( pNtk, 1000, fVerbose );
    else if ( fGreedy )
        Abc_NtkEliminate( pNtk, nMaxSize, fReverse, fVerbose );
    else
        Abc_NtkEliminate1( pNtk, ElimValue, nMaxSize, nIterMax, fReverse, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: eliminate [-VNI <num>] [-grsvh]\n");
    Abc_Print( -2, "\t           traditional \"eliminate -1\", which collapses the node into its fanout\n");
    Abc_Print( -2, "\t           if the node's variable appears in the fanout's factored form only once\n");
    Abc_Print( -2, "\t-V <num> : the \"value\" parameter used by \"eliminate\" in SIS [default = %d]\n", ElimValue );
    Abc_Print( -2, "\t-N <num> : the maximum node support after collapsing [default = %d]\n", nMaxSize );
    Abc_Print( -2, "\t-I <num> : the maximum number of iterations [default = %d]\n", nIterMax );
    Abc_Print( -2, "\t-g       : toggle using greedy eliminate (without \"value\") [default = %s]\n", fGreedy? "yes": "no" );
    Abc_Print( -2, "\t-r       : use the reverse topological order [default = %s]\n", fReverse? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggle eliminating similar nodes [default = %s]\n", fSpecial? "yes": "no" );
    Abc_Print( -2, "\t-v       : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}